

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O3

void qtree_onebit(int *a,int n,int nx,int ny,uchar *b,int bit)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uchar *puVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  
  bVar2 = (byte)bit;
  uVar13 = 2 << (bVar2 & 0x1f);
  uVar4 = 4 << (bVar2 & 0x1f);
  uVar9 = 8 << (bVar2 & 0x1f);
  iVar5 = 0;
  iVar10 = 0;
  if (1 < nx) {
    iVar11 = 0;
    iVar10 = 0;
    iVar5 = 0;
    iVar6 = n;
    do {
      if (ny < 2) {
        iVar8 = iVar10 * n;
        iVar1 = n + iVar8;
        uVar3 = 0;
      }
      else {
        lVar12 = 0;
        iVar8 = 0;
        do {
          b[lVar12 + iVar5] =
               (uchar)((int)(a[(long)iVar11 + lVar12 * 2] << 3 & uVar9 |
                             a[(long)iVar11 + lVar12 * 2 + 1] << 2 & uVar4 |
                            a[(long)iVar6 + lVar12 * 2] * 2 & uVar13 |
                            a[(long)iVar6 + lVar12 * 2 + 1] & 1 << (bVar2 & 0x1f)) >> (bVar2 & 0x1f)
                      );
          iVar8 = iVar8 + 2;
          lVar12 = lVar12 + 1;
        } while (iVar8 < ny + -1);
        iVar5 = iVar5 + (int)lVar12;
        iVar1 = iVar6 + iVar8;
        iVar8 = iVar8 + iVar11;
        uVar3 = ny & 0xfffffffe;
      }
      if ((int)uVar3 < ny) {
        b[iVar5] = (uchar)((int)(a[iVar8] << 3 & uVar9 | a[iVar1] * 2 & uVar13) >> (bVar2 & 0x1f));
        iVar5 = iVar5 + 1;
      }
      iVar10 = iVar10 + 2;
      iVar11 = iVar11 + n * 2;
      iVar6 = iVar6 + n * 2;
    } while (iVar10 < nx + -1);
  }
  if (iVar10 < nx) {
    iVar10 = iVar10 * n;
    uVar13 = 0;
    if (1 < ny) {
      uVar13 = ny & 0x7ffffffe;
      puVar7 = b + iVar5;
      lVar12 = 0;
      do {
        *puVar7 = (uchar)((int)(a[iVar10 + lVar12] << 3 & uVar9 |
                               a[(long)iVar10 + lVar12 + 1] << 2 & uVar4) >> (bVar2 & 0x1f));
        puVar7 = puVar7 + 1;
        iVar5 = iVar5 + 1;
        lVar12 = lVar12 + 2;
      } while ((int)lVar12 < ny + -1);
      iVar10 = iVar10 + (int)lVar12;
    }
    if ((int)uVar13 < ny) {
      b[iVar5] = (uchar)((int)(a[iVar10] << 3 & uVar9) >> (bVar2 & 0x1f));
    }
  }
  return;
}

Assistant:

static void
qtree_onebit(int a[], int n, int nx, int ny, unsigned char b[], int bit)
{
int i, j, k;
int b0, b1, b2, b3;
int s10, s00;

	/*
	 * use selected bit to get amount to shift
	 */
	b0 = 1<<bit;
	b1 = b0<<1;
	b2 = b0<<2;
	b3 = b0<<3;
	k = 0;							/* k is index of b[i/2,j/2]	*/
	for (i = 0; i<nx-1; i += 2) {
		s00 = n*i;					/* s00 is index of a[i,j]	*/
/* tried using s00+n directly in the statements, but this had no effect on performance */
		s10 = s00+n;				/* s10 is index of a[i+1,j]	*/
		for (j = 0; j<ny-1; j += 2) {

/*
 this was not any faster..
 
         b[k] = (a[s00]  & b0) ? 
	            (a[s00+1] & b0) ?
	                (a[s10] & b0)   ?
		            (a[s10+1] & b0) ? 15 : 14
                         :  (a[s10+1] & b0) ? 13 : 12
		      : (a[s10] & b0)   ?
		            (a[s10+1] & b0) ? 11 : 10
                         :  (a[s10+1] & b0) ?  9 :  8
	          : (a[s00+1] & b0) ?
	                (a[s10] & b0)   ?
		            (a[s10+1] & b0) ? 7 : 6
                         :  (a[s10+1] & b0) ? 5 : 4

		      : (a[s10] & b0)   ?
		            (a[s10+1] & b0) ? 3 : 2
                         :  (a[s10+1] & b0) ? 1 : 0;
*/

/*
this alternative way of calculating b[k] was slowwer than the original code
		    if ( a[s00]     & b0)
			if ( a[s00+1]     & b0)
			    if ( a[s10]     & b0)
				if ( a[s10+1]     & b0)
					b[k] = 15;
				else
					b[k] = 14;
			    else
				if ( a[s10+1]     & b0)
					b[k] = 13;
				else
					b[k] = 12;
			else
			    if ( a[s10]     & b0)
				if ( a[s10+1]     & b0)
					b[k] = 11;
				else
					b[k] = 10;
			    else
				if ( a[s10+1]     & b0)
					b[k] = 9;
				else
					b[k] = 8;
		    else
			if ( a[s00+1]     & b0)
			    if ( a[s10]     & b0)
				if ( a[s10+1]     & b0)
					b[k] = 7;
				else
					b[k] = 6;
			    else
				if ( a[s10+1]     & b0)
					b[k] = 5;
				else
					b[k] = 4;
			else
			    if ( a[s10]     & b0)
				if ( a[s10+1]     & b0)
					b[k] = 3;
				else
					b[k] = 2;
			    else
				if ( a[s10+1]     & b0)
					b[k] = 1;
				else
					b[k] = 0;
*/
			


			b[k] = ( ( a[s10+1]     & b0)
				   | ((a[s10  ]<<1) & b1)
				   | ((a[s00+1]<<2) & b2)
				   | ((a[s00  ]<<3) & b3) ) >> bit;

			k += 1;
			s00 += 2;
			s10 += 2;
		}
		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1,s10+1 are off edge
			 */
			b[k] = ( ((a[s10  ]<<1) & b1)
				   | ((a[s00  ]<<3) & b3) ) >> bit;
			k += 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10,s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {
			b[k] = ( ((a[s00+1]<<2) & b2)
				   | ((a[s00  ]<<3) & b3) ) >> bit;
			k += 1;
			s00 += 2;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */
			b[k] = ( ((a[s00  ]<<3) & b3) ) >> bit;
			k += 1;
		}
	}
}